

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateParallel::Initialize
          (ChLinkMateParallel *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> *mpt1,
          ChVector<double> *mpt2,ChVector<double> mnorm1,ChVector<double> mnorm2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_b8;
  ChVector<double> local_a8;
  ChVector<double> local_88;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  uVar1 = *(undefined4 *)mnorm1.m_data[0];
  uVar6 = *(uint *)((long)mnorm1.m_data[0] + 4);
  if (this->flipped == false) {
    uVar2 = *(undefined4 *)((long)mnorm1.m_data[0] + 8);
    uVar3 = *(uint *)((long)mnorm1.m_data[0] + 0xc);
    uVar4 = *(undefined4 *)((long)mnorm1.m_data[0] + 0x10);
    uVar5 = *(uint *)((long)mnorm1.m_data[0] + 0x14);
  }
  else {
    uVar6 = uVar6 ^ 0x80000000;
    uVar2 = *(undefined4 *)((long)mnorm1.m_data[0] + 8);
    uVar4 = *(undefined4 *)((long)mnorm1.m_data[0] + 0x10);
    uVar3 = *(uint *)((long)mnorm1.m_data[0] + 0xc) ^ 0x80000000;
    uVar5 = *(uint *)((long)mnorm1.m_data[0] + 0x14) ^ 0x80000000;
  }
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,&mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,&mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_68.m_data[0] = mpt1->m_data[0];
  local_68.m_data[1] = mpt1->m_data[1];
  local_68.m_data[2] = mpt1->m_data[2];
  local_88.m_data[0] = mpt2->m_data[0];
  local_88.m_data[1] = mpt2->m_data[1];
  local_88.m_data[2] = mpt2->m_data[2];
  local_48.m_data[0] = (double)CONCAT44(uVar6,uVar1);
  local_48.m_data[1] = (double)CONCAT44(uVar3,uVar2);
  local_48.m_data[2] = (double)CONCAT44(uVar5,uVar4);
  local_a8.m_data[0] = *(double *)mnorm1.m_data[1];
  local_a8.m_data[1] = *(double *)((long)mnorm1.m_data[1] + 8);
  local_a8.m_data[2] = *(double *)((long)mnorm1.m_data[1] + 0x10);
  ChLinkMateGeneric::Initialize
            (&this->super_ChLinkMateGeneric,(shared_ptr<chrono::ChBodyFrame> *)&local_b8,
             (shared_ptr<chrono::ChBodyFrame> *)&local_c8,pos_are_relative,&local_68,&local_88,
             &local_48,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  return;
}

Assistant:

void ChLinkMateParallel::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                    std::shared_ptr<ChBodyFrame> mbody2,
                                    bool pos_are_relative,
                                    ChVector<> mpt1,
                                    ChVector<> mpt2,
                                    ChVector<> mnorm1,
                                    ChVector<> mnorm2) {
    // set the two frames so that they have the X axis aligned when the
    // two axes are aligned (default behavior, otherwise is considered 'flipped')

    ChVector<> mnorm1_reversed;
    if (!flipped)
        mnorm1_reversed = mnorm1;
    else
        mnorm1_reversed = -mnorm1;

    ChLinkMateGeneric::Initialize(mbody1, mbody2, pos_are_relative, mpt1, mpt2, mnorm1_reversed, mnorm2);
}